

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O1

bool __thiscall Rml::FontEffectOutline::Initialise(FontEffectOutline *this,int _width)

{
  int iVar1;
  bool bVar2;
  float *pfVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  if (0 < _width) {
    this->width = _width;
    ConvolutionFilter::Initialise(&this->filter,_width,Dilation);
    uVar5 = this->width;
    if (-1 < (int)uVar5) {
      iVar7 = -uVar5;
      do {
        if (SBORROW4(this->width,-uVar5) == (int)(this->width + uVar5) < 0) {
          uVar6 = ~uVar5;
          lVar4 = (long)(int)-uVar5;
          do {
            fVar8 = Math::SquareRoot((float)((int)lVar4 * (int)lVar4 + iVar7 * iVar7));
            iVar1 = this->width;
            fVar9 = 1.0;
            if (((float)iVar1 < fVar8) && (fVar9 = (float)(iVar1 + 1) - fVar8, fVar9 <= 0.0)) {
              fVar9 = 0.0;
            }
            pfVar3 = ConvolutionFilter::operator[](&this->filter,iVar1 + iVar7);
            iVar1 = this->width;
            pfVar3[iVar1 + lVar4] = fVar9;
            uVar6 = uVar6 + 1;
            lVar4 = lVar4 + 1;
          } while ((int)uVar6 < iVar1);
        }
        uVar5 = this->width;
        bVar2 = iVar7 < (int)uVar5;
        iVar7 = iVar7 + 1;
      } while (bVar2);
    }
  }
  return 0 < _width;
}

Assistant:

bool FontEffectOutline::Initialise(int _width)
{
	if (_width <= 0)
		return false;

	width = _width;

	filter.Initialise(width, FilterOperation::Dilation);
	for (int x = -width; x <= width; ++x)
	{
		for (int y = -width; y <= width; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width)
			{
				weight = (width + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter[x + width][y + width] = weight;
		}
	}

	return true;
}